

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O3

void __thiscall
anon_unknown.dwarf_1841ac6::BacktraceData::BacktraceData(BacktraceData *this,string *topSource)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  paVar1 = &(this->TopSource).field_2;
  (this->TopSource)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (topSource->_M_dataplus)._M_p;
  paVar2 = &topSource->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&topSource->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->TopSource).field_2 + 8) = uVar4;
  }
  else {
    (this->TopSource)._M_dataplus._M_p = pcVar3;
    (this->TopSource).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->TopSource)._M_string_length = topSource->_M_string_length;
  (topSource->_M_dataplus)._M_p = (pointer)paVar2;
  topSource->_M_string_length = 0;
  (topSource->field_2)._M_local_buf[0] = '\0';
  (this->CommandMap)._M_h._M_buckets = &(this->CommandMap)._M_h._M_single_bucket;
  (this->CommandMap)._M_h._M_bucket_count = 1;
  (this->CommandMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->CommandMap)._M_h._M_element_count = 0;
  (this->CommandMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->CommandMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->CommandMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->FileMap)._M_h._M_buckets = &(this->FileMap)._M_h._M_single_bucket;
  (this->FileMap)._M_h._M_bucket_count = 1;
  (this->FileMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->FileMap)._M_h._M_element_count = 0;
  (this->FileMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->FileMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->FileMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->NodeMap)._M_h._M_buckets = &(this->NodeMap)._M_h._M_single_bucket;
  (this->NodeMap)._M_h._M_bucket_count = 1;
  (this->NodeMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->NodeMap)._M_h._M_element_count = 0;
  (this->NodeMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->NodeMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->NodeMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  Json::Value::Value(&this->Commands,arrayValue);
  Json::Value::Value(&this->Files,arrayValue);
  Json::Value::Value(&this->Nodes,arrayValue);
  return;
}

Assistant:

BacktraceData::BacktraceData(std::string topSource)
  : TopSource(std::move(topSource))
{
}